

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QDBusUnixFileDescriptor>::moveAppend
          (QGenericArrayOps<QDBusUnixFileDescriptor> *this,QDBusUnixFileDescriptor *b,
          QDBusUnixFileDescriptor *e)

{
  QDBusUnixFileDescriptor *pQVar1;
  QDBusUnixFileDescriptor *in_RDX;
  QDBusUnixFileDescriptor *in_RSI;
  long in_RDI;
  QDBusUnixFileDescriptor *data;
  QDBusUnixFileDescriptor *local_10;
  
  if (in_RSI != in_RDX) {
    pQVar1 = QArrayDataPointer<QDBusUnixFileDescriptor>::begin
                       ((QArrayDataPointer<QDBusUnixFileDescriptor> *)0xad3bc7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QDBusUnixFileDescriptor::QDBusUnixFileDescriptor
                (pQVar1 + *(long *)(in_RDI + 0x10) * 8,local_10);
      local_10 = local_10 + 8;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }